

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O1

void receive_obj_proc(Am_Connection *my_connection_ptr)

{
  Am_Connection_Data *pAVar1;
  Am_Receive_Method_Type *pAVar2;
  bool bVar3;
  ostream *poVar4;
  Am_Value val;
  Am_Object local_30;
  Am_Value_List local_28;
  
  Am_Value_List::Pop(&local_28,(bool)((char)my_connection_ptr->data + '\x18'));
  Am_Object::Am_Object(&local_30,(Am_Value *)&local_28);
  bVar3 = Am_Object::operator==(&Am_No_Object,&local_30);
  Am_Object::~Am_Object(&local_30);
  pAVar2 = receive_obj_slots.Call;
  if (bVar3) {
    pAVar1 = my_connection_ptr->data;
    (pAVar1->my_receiver).from_wrapper = receive_obj_slots.from_wrapper;
    (pAVar1->my_receiver).Call = pAVar2;
    Am_Value::~Am_Value((Am_Value *)&local_28);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"I expected Unmarshall Object\'s bogus return value and got ",
             0x3a);
  poVar4 = operator<<((ostream *)&std::cerr,(Am_Value *)&local_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," instead! \n",0xb);
  Am_Error("Mangled incoming object!");
}

Assistant:

Am_Define_Method(Am_Receive_Method, void, receive_obj,
                 (Am_Connection * my_connection_ptr))
{
  Am_Value val = my_connection_ptr->Receive();
  if (Am_No_Object == (Am_Object)val) {
    my_connection_ptr->Receive_Object_Slots();
  } else {
    std::cerr << "I expected Unmarshall Object's bogus return value and got ";
    std::cerr << val << " instead! \n";
    Am_Error("Mangled incoming object!");
  }
}